

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::format<int,unsigned_int,unsigned_int>
               (ostream *out,char *fmt,int *args,uint *args_1,uint *args_2)

{
  ostream *in_RSI;
  uint *in_RDI;
  long in_FS_OFFSET;
  FormatListRef in_stack_ffffffffffffff58;
  int local_60 [22];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  makeFormatList<int,unsigned_int,unsigned_int>(local_60,(uint *)in_RSI,in_RDI);
  vformat(in_RSI,(char *)in_RDI,in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}